

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 gen_ldst(DisasContext_conflict2 *s,int opsize,TCGv_i32 addr,TCGv_i32 val,ea_what what,
                 int index)

{
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 tmp;
  TCGContext_conflict2 *tcg_ctx;
  int index_local;
  ea_what what_local;
  TCGv_i32 val_local;
  TCGv_i32 addr_local;
  int opsize_local;
  DisasContext_conflict2 *s_local;
  
  if (what == EA_STORE) {
    pTVar1 = s->uc->tcg_ctx;
    gen_store(s,opsize,addr,val,index);
    s_local = (DisasContext_conflict2 *)pTVar1->store_dummy;
  }
  else {
    tmp = gen_load(s,opsize,addr,(uint)(what == EA_LOADS),index);
    s_local = (DisasContext_conflict2 *)mark_to_release(s,tmp);
  }
  return (TCGv_i32)s_local;
}

Assistant:

static TCGv gen_ldst(DisasContext *s, int opsize, TCGv addr, TCGv val,
                     ea_what what, int index)
{
    if (what == EA_STORE) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;
        gen_store(s, opsize, addr, val, index);
        return tcg_ctx->store_dummy;
    } else {
        return mark_to_release(s, gen_load(s, opsize, addr,
                                           what == EA_LOADS, index));
    }
}